

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

boolean equip_is_worn(obj *otmp)

{
  byte bVar1;
  int iVar2;
  int iVar5;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar2 = (int)otmp;
  iVar5 = (int)((ulong)otmp >> 0x20);
  auVar8._0_4_ = -(uint)((int)uarmf == iVar2);
  auVar8._4_4_ = -(uint)((int)((ulong)uarmf >> 0x20) == iVar5);
  auVar8._8_4_ = -(uint)((int)uarmc == iVar2);
  auVar8._12_4_ = -(uint)((int)((ulong)uarmc >> 0x20) == iVar5);
  auVar11._4_4_ = auVar8._0_4_;
  auVar11._0_4_ = auVar8._4_4_;
  auVar11._8_4_ = auVar8._12_4_;
  auVar11._12_4_ = auVar8._8_4_;
  auVar10._0_4_ = -(uint)((int)uarmg == iVar2);
  auVar10._4_4_ = -(uint)((int)((ulong)uarmg >> 0x20) == iVar5);
  auVar10._8_4_ = -(uint)((int)uarmh == iVar2);
  auVar10._12_4_ = -(uint)((int)((ulong)uarmh >> 0x20) == iVar5);
  auVar9._4_4_ = auVar10._0_4_;
  auVar9._0_4_ = auVar10._4_4_;
  auVar9._8_4_ = auVar10._12_4_;
  auVar9._12_4_ = auVar10._8_4_;
  auVar10 = packssdw(auVar9 & auVar10,auVar11 & auVar8);
  auVar6._0_4_ = -(uint)((int)uamul == iVar2);
  auVar6._4_4_ = -(uint)((int)((ulong)uamul >> 0x20) == iVar5);
  auVar6._8_4_ = -(uint)((int)uarms == iVar2);
  auVar6._12_4_ = -(uint)((int)((ulong)uarms >> 0x20) == iVar5);
  auVar7._4_4_ = auVar6._0_4_;
  auVar7._0_4_ = auVar6._4_4_;
  auVar7._8_4_ = auVar6._12_4_;
  auVar7._12_4_ = auVar6._8_4_;
  auVar4._0_4_ = -(uint)((int)uright == iVar2);
  auVar4._4_4_ = -(uint)((int)((ulong)uright >> 0x20) == iVar5);
  auVar4._8_4_ = -(uint)((int)uleft == iVar2);
  auVar4._12_4_ = -(uint)((int)((ulong)uleft >> 0x20) == iVar5);
  auVar3._4_4_ = auVar4._0_4_;
  auVar3._0_4_ = auVar4._4_4_;
  auVar3._8_4_ = auVar4._12_4_;
  auVar3._12_4_ = auVar4._8_4_;
  auVar4 = packssdw(auVar3 & auVar4,auVar7 & auVar6);
  auVar4 = packssdw(auVar4,auVar10);
  if ((((((((((auVar4 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar4 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar4 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar4 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar4[0xf]) &&
      (uarmu != otmp)) && (uarm != otmp)) {
    return '\0';
  }
  bVar1 = donning_on(otmp);
  return bVar1 ^ 1;
}

Assistant:

boolean equip_is_worn(const struct obj *otmp)
{
	boolean worn = FALSE;

	if (otmp == uarm) worn = TRUE;
	if (otmp == uarmu) worn = TRUE;
	if (otmp == uarmc) worn = TRUE;
	if (otmp == uarmf) worn = TRUE;
	if (otmp == uarmh) worn = TRUE;
	if (otmp == uarmg) worn = TRUE;
	if (otmp == uarms) worn = TRUE;

	if (otmp == uamul) worn = TRUE;
	if (otmp == uleft) worn = TRUE;
	if (otmp == uright) worn = TRUE;

	/*
	 * Beware: Gives a false positive between cancel_don() and Foo_off().
	 * See caveat in donning_on() for details.
	 */
	return !!(worn && !donning_on(otmp));
}